

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

void newenv(void)

{
  Env *p;
  Env *in_stack_fffffffffffffff0;
  
  p = (Env *)operator_new(0x68);
  Env::Env(in_stack_fffffffffffffff0,p);
  current = p;
  return;
}

Assistant:

void newenv() {
    current = new Env(current);
}